

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FMugShotFrame,_FMugShotFrame>::DoCopy
          (TArray<FMugShotFrame,_FMugShotFrame> *this,TArray<FMugShotFrame,_FMugShotFrame> *other)

{
  uint uVar1;
  FMugShotFrame *pFVar2;
  uint local_1c;
  uint i;
  TArray<FMugShotFrame,_FMugShotFrame> *other_local;
  TArray<FMugShotFrame,_FMugShotFrame> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (FMugShotFrame *)0x0;
  }
  else {
    pFVar2 = (FMugShotFrame *)
             M_Malloc_Dbg((ulong)this->Most * 0x18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                          ,0x199);
    this->Array = pFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      FMugShotFrame::FMugShotFrame(this->Array + local_1c,other->Array + local_1c);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}